

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O0

void GetTopRightScreenSize(int *outLeft,int *outTop,int *outRight,int *outBottom)

{
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  
  rm_b = 0;
  rm_r = 0;
  rm_t = 0;
  rm_l = 0;
  rm_idx = 0x7fffffff;
  XPLMGetAllMonitorBoundsGlobal(CBRightTopMostMonitorGlobal,0);
  if ((((rm_l == 0) && (rm_t == 0)) && (rm_r == 0)) && (rm_b == 0)) {
    *in_RCX = 0;
    *in_RDI = 0;
    XPLMGetScreenSize(in_RDX,in_RSI);
  }
  else {
    *in_RDI = rm_l;
    *in_RSI = rm_t;
    *in_RDX = rm_r;
    *in_RCX = rm_b;
  }
  return;
}

Assistant:

void GetTopRightScreenSize (int& outLeft,
                            int& outTop,
                            int& outRight,
                            int& outBottom)
{
    // find window coordinates
    // this will only find full screen monitors!
    rm_l = rm_t = rm_r = rm_b = 0;
    rm_idx = INT_MAX;
    
    // fetch global bounds of X-Plane-used windows
    XPLMGetAllMonitorBoundsGlobal (CBRightTopMostMonitorGlobal, NULL);
    
    // did we find something? then return it
    if ( rm_l || rm_t || rm_r || rm_b ) {
        outLeft     = rm_l;
        outTop      = rm_t;
        outRight    = rm_r;
        outBottom   = rm_b;
        return;
    }
    
    // if we didn't find anything we are running in windowed mode
    outLeft = outBottom = 0;
    XPLMGetScreenSize(&outRight,&outTop);
}